

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Segment::MoveCuesBeforeClusters(Segment *this)

{
  Cues *this_00;
  int iVar1;
  uint32_t uVar2;
  uint64_t in_RAX;
  uint64_t uVar3;
  uint64_t value;
  uint64 uVar4;
  ulong uVar5;
  int32_t i;
  ulong uVar6;
  int32_t index;
  uint64_t uVar7;
  ulong uVar8;
  long lVar9;
  uint64_t local_38;
  
  this_00 = &this->cues_;
  local_38 = in_RAX;
  uVar3 = Cues::Size(this_00);
  if (0 < (this->cues_).cue_entries_size_) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      value = CuePoint::PayloadSize((this->cues_).cue_entries_[lVar9]);
      uVar4 = EbmlMasterElementSize(0xbb,value);
      uVar7 = uVar7 + value + uVar4;
      lVar9 = lVar9 + 1;
      iVar1 = (this->cues_).cue_entries_size_;
    } while (lVar9 < iVar1);
    local_38 = uVar7;
    if (0 < iVar1) {
      index = 0;
      do {
        MoveCuesBeforeClustersHelper(this,uVar3,index,&local_38);
        index = index + 1;
      } while (index < (this->cues_).cue_entries_size_);
    }
  }
  uVar6 = 0;
  uVar5 = 0;
  uVar8 = 0;
  do {
    uVar2 = (this->seek_head_).seek_entry_id_[uVar6];
    if (uVar2 == 0x1f43b675) {
      uVar8 = uVar6 & 0xffffffff;
    }
    if (uVar2 == 0x1c53bb6b) {
      uVar5 = uVar6 & 0xffffffff;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 5);
  uVar3 = 0xffffffffffffffff;
  if ((uint)uVar8 < 5) {
    uVar3 = (this->seek_head_).seek_entry_pos_[uVar8];
  }
  if ((uint)uVar5 < 5) {
    (this->seek_head_).seek_entry_id_[uVar5] = 0x1c53bb6b;
    (this->seek_head_).seek_entry_pos_[uVar5] = uVar3;
    uVar7 = Cues::Size(this_00);
    uVar3 = (this->seek_head_).seek_entry_pos_[uVar5];
  }
  else {
    uVar7 = Cues::Size(this_00);
    uVar3 = 0xffffffffffffffff;
  }
  if ((uint)uVar8 < 5) {
    (this->seek_head_).seek_entry_id_[uVar8] = 0x1f43b675;
    (this->seek_head_).seek_entry_pos_[uVar8] = uVar3 + uVar7;
  }
  return;
}

Assistant:

void Segment::MoveCuesBeforeClusters() {
  const uint64_t current_cue_size = cues_.Size();
  uint64_t cue_size = 0;
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    cue_size += cues_.GetCueByIndex(i)->Size();
  for (int32_t i = 0; i < cues_.cue_entries_size(); ++i)
    MoveCuesBeforeClustersHelper(current_cue_size, i, &cue_size);

  // Adjust the Seek Entry to reflect the change in position
  // of Cluster and Cues
  int32_t cluster_index = 0;
  int32_t cues_index = 0;
  for (int32_t i = 0; i < SeekHead::kSeekEntryCount; ++i) {
    if (seek_head_.GetId(i) == libwebm::kMkvCluster)
      cluster_index = i;
    if (seek_head_.GetId(i) == libwebm::kMkvCues)
      cues_index = i;
  }
  seek_head_.SetSeekEntry(cues_index, libwebm::kMkvCues,
                          seek_head_.GetPosition(cluster_index));
  seek_head_.SetSeekEntry(cluster_index, libwebm::kMkvCluster,
                          cues_.Size() + seek_head_.GetPosition(cues_index));
}